

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

UnblindParameter * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxOut
          (UnblindParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_out_index,Privkey *blinding_key)

{
  size_t sVar1;
  CfdException *this_00;
  uint32_t tx_out_index_local;
  ConfidentialNonce local_1f0;
  Script local_1c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  ConfidentialValue local_178;
  ConfidentialAssetId local_150;
  ConfidentialTxOut tx_out;
  
  tx_out_index_local = tx_out_index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,(ulong)tx_out_index,0xb46,"UnblindTxOut");
  ConfidentialTxOut::ConfidentialTxOut
            (&tx_out,(this->vout_).
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_start + tx_out_index);
  ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&local_1c8,&tx_out.asset_);
  if (1 < (byte)local_1c8.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    ConfidentialNonce::ConfidentialNonce(&local_1f0,&tx_out.nonce_);
    if (1 < local_1f0.version_) {
      ConfidentialValue::ConfidentialValue(&local_178,&tx_out.confidential_value_);
      if (1 < local_178.version_) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150,
                   &tx_out.range_proof_.data_);
        sVar1 = ByteData::GetDataSize((ByteData *)&local_150);
        if (sVar1 != 0) {
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_190,
                     &tx_out.surjection_proof_.data_);
          sVar1 = ByteData::GetDataSize((ByteData *)&local_190);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_190);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150);
          ConfidentialValue::~ConfidentialValue(&local_178);
          ConfidentialNonce::~ConfidentialNonce(&local_1f0);
          ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&local_1c8);
          if (sVar1 != 0) {
            ConfidentialNonce::ConfidentialNonce(&local_1f0,&tx_out.nonce_);
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_190,
                       &tx_out.range_proof_.data_);
            ConfidentialValue::ConfidentialValue(&local_178,&tx_out.confidential_value_);
            AbstractTxOut::GetLockingScript(&local_1c8,&tx_out.super_AbstractTxOut);
            ConfidentialAssetId::ConfidentialAssetId(&local_150,&tx_out.asset_);
            CalculateUnblindData
                      (__return_storage_ptr__,&local_1f0,blinding_key,(ByteData *)&local_190,
                       &local_178,&local_1c8,&local_150);
            ConfidentialAssetId::~ConfidentialAssetId(&local_150);
            Script::~Script(&local_1c8);
            ConfidentialValue::~ConfidentialValue(&local_178);
            ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_190);
            ConfidentialNonce::~ConfidentialNonce(&local_1f0);
            ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_1c8);
            ByteData::ByteData((ByteData *)&local_1f0);
            ByteData::ByteData((ByteData *)&local_178);
            SetTxOutCommitment(this,tx_out_index,&__return_storage_ptr__->asset,
                               &__return_storage_ptr__->value,(ConfidentialNonce *)&local_1c8,
                               (ByteData *)&local_1f0,(ByteData *)&local_178);
            ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178);
            ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f0);
            ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&local_1c8);
            ConfidentialTxOut::~ConfidentialTxOut(&tx_out);
            return __return_storage_ptr__;
          }
          goto LAB_003b35a4;
        }
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150);
      }
      ConfidentialValue::~ConfidentialValue(&local_178);
    }
    ConfidentialNonce::~ConfidentialNonce(&local_1f0);
  }
  ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&local_1c8);
LAB_003b35a4:
  local_1c8._vptr_Script = (_func_int **)0x4b5368;
  local_1c8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb4e;
  local_1c8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "UnblindTxOut";
  logger::warn<unsigned_int&>
            ((CfdSourceLocation *)&local_1c8,
             "Failed to unblind TxOut. Target TxOut already unblinded.: tx_out_index=[{}]",
             &tx_out_index_local);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_1c8,"Failed to unblind TxOut. Target TxOut already unblinded.",
             (allocator *)&local_1f0);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_1c8);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::UnblindTxOut(
    uint32_t tx_out_index, const Privkey &blinding_key) {
  CheckTxOutIndex(tx_out_index, __LINE__, __FUNCTION__);

  ConfidentialTxOut tx_out(vout_[tx_out_index]);
  if (!tx_out.GetAsset().HasBlinding() || !tx_out.GetNonce().HasBlinding() ||
      !tx_out.GetConfidentialValue().HasBlinding() ||
      (tx_out.GetRangeProof().GetDataSize() == 0) ||
      (tx_out.GetSurjectionProof().GetDataSize() == 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxOut. Target TxOut already unblinded.: "
        "tx_out_index=[{}]",
        tx_out_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxOut. Target TxOut already unblinded.");
  }

  UnblindParameter result = CalculateUnblindData(
      tx_out.GetNonce(), blinding_key, tx_out.GetRangeProof(),
      tx_out.GetConfidentialValue(), tx_out.GetLockingScript(),
      tx_out.GetAsset());

  // clear and set unblind value to txout
  SetTxOutCommitment(
      tx_out_index, result.asset, result.value, ConfidentialNonce(),
      ByteData(), ByteData());

  return result;
}